

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynWhile * ParseWhile(ParseContext *ctx)

{
  Lexeme *begin;
  int iVar1;
  SynBase *this;
  undefined4 extraout_var;
  SynBase *pSVar2;
  SynWhile *this_00;
  undefined4 extraout_var_00;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_while) {
    ctx->currentLexeme = begin + 1;
    anon_unknown.dwarf_16d1cf::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' not found after \'while\'")
    ;
    this = ParseAssignment(ctx);
    if (this == (SynBase *)0x0) {
      anon_unknown.dwarf_16d1cf::Report
                (ctx,ctx->currentLexeme,"ERROR: expression expected after \'while(\'");
      iVar1 = (*ctx->allocator->_vptr_Allocator[2])();
      this = (SynBase *)CONCAT44(extraout_var,iVar1);
      SynBase::SynBase(this,0,ctx->currentLexeme,ctx->currentLexeme);
      this->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f6d38;
    }
    anon_unknown.dwarf_16d1cf::CheckConsume
              (ctx,lex_cparen,
               "ERROR: closing \')\' not found after expression in \'while\' statement");
    pSVar2 = ParseExpression(ctx);
    if (pSVar2 == (SynBase *)0x0) {
      if (ctx->currentLexeme->type == lex_semicolon) {
        ctx->currentLexeme = ctx->currentLexeme + 1;
      }
      else {
        anon_unknown.dwarf_16d1cf::Report
                  (ctx,ctx->currentLexeme,"ERROR: body not found after \'while\' header");
      }
    }
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    this_00 = (SynWhile *)CONCAT44(extraout_var_00,iVar1);
    if (ctx->currentLexeme <= ctx->firstLexeme) {
      __assert_fail("currentLexeme > firstLexeme",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0x19c,"Lexeme *ParseContext::Previous()");
    }
    SynBase::SynBase((SynBase *)this_00,0x2b,begin,ctx->currentLexeme + -1);
    (this_00->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f7f88;
    this_00->condition = this;
    this_00->body = pSVar2;
  }
  else {
    this_00 = (SynWhile *)0x0;
  }
  return this_00;
}

Assistant:

SynWhile* ParseWhile(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_while))
	{
		CheckConsume(ctx, lex_oparen, "ERROR: '(' not found after 'while'");

		SynBase *condition = ParseAssignment(ctx);

		if(!condition)
		{
			Report(ctx, ctx.Current(), "ERROR: expression expected after 'while('");

			condition = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_cparen, "ERROR: closing ')' not found after expression in 'while' statement");

		SynBase *body = ParseExpression(ctx);

		if(!body && !ctx.Consume(lex_semicolon))
			Report(ctx, ctx.Current(), "ERROR: body not found after 'while' header");

		return new (ctx.get<SynWhile>()) SynWhile(start, ctx.Previous(), condition, body);
	}

	return NULL;
}